

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O0

void __thiscall MPSegmentTest_Test1_Test::TestBody(MPSegmentTest_Test1_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string s;
  MPSegment segment;
  string *in_stack_fffffffffffffb38;
  MPSegment *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  string *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  int iVar2;
  string *this_00;
  string *in_stack_fffffffffffffb60;
  Message *file;
  string *in_stack_fffffffffffffb68;
  string *connector;
  Type type;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffb70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  undefined1 uVar3;
  Message *in_stack_fffffffffffffb98;
  Message *message;
  AssertHelper *in_stack_fffffffffffffba0;
  AssertHelper *this_01;
  AssertionResult local_390;
  undefined1 local_379 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd00;
  AssertionResult local_2f0;
  undefined8 local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  string local_2a8 [39];
  allocator<char> local_281;
  string local_280 [48];
  AssertionResult local_250;
  allocator<char> local_239;
  string local_238 [48];
  AssertionResult local_208;
  allocator<char> local_1f1;
  string local_1f0 [48];
  AssertionResult local_1c0;
  allocator<char> local_1a9;
  string local_1a8 [48];
  AssertionResult local_178;
  allocator<char> local_161;
  string local_160 [36];
  uint local_13c;
  AssertionResult local_128;
  allocator<char> local_111;
  string local_110 [32];
  Message local_f0 [3];
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [55];
  allocator<char> local_79;
  string local_78 [120];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
             (char *)in_stack_fffffffffffffb78._M_current,
             (allocator<char> *)in_stack_fffffffffffffb70._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
             (char *)in_stack_fffffffffffffb78._M_current,
             (allocator<char> *)in_stack_fffffffffffffb70._M_current);
  cppjieba::MPSegment::MPSegment
            ((MPSegment *)in_stack_fffffffffffffb70._M_current,in_stack_fffffffffffffb68,
             in_stack_fffffffffffffb60);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::string(local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1c8672);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
             (char *)in_stack_fffffffffffffb78._M_current,
             (allocator<char> *)in_stack_fffffffffffffb70._M_current);
  cppjieba::MPSegment::Cut
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1c86c2);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::operator<<(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  testing::internal::EqHelper<false>::Compare<char[47],std::__cxx11::string>
            (in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50,
             (char (*) [47])CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70._M_current);
    testing::AssertionResult::failure_message((AssertionResult *)0x1c8864);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb70._M_current,
               (Type)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60,
               (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(char *)in_stack_fffffffffffffb50);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
    testing::Message::~Message((Message *)0x1c88c7);
  }
  local_13c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c8935);
  if (local_13c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
               (char *)in_stack_fffffffffffffb78._M_current,
               (allocator<char> *)in_stack_fffffffffffffb70._M_current);
    cppjieba::MPSegment::Cut
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1c8996);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator(&local_161);
    std::operator<<(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[22]>
              (in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
               (char (*) [22])in_stack_fffffffffffffb40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70._M_current);
      testing::AssertionResult::failure_message((AssertionResult *)0x1c8ab5);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb70._M_current,
                 (Type)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60,
                 (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(char *)in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      testing::Message::~Message((Message *)0x1c8b18);
    }
    local_13c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c8b86);
    if (local_13c == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 (char *)in_stack_fffffffffffffb78._M_current,
                 (allocator<char> *)in_stack_fffffffffffffb70._M_current);
      cppjieba::MPSegment::Cut
                (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1c8be7);
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      std::operator<<(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      testing::internal::EqHelper<false>::Compare<char[30],std::__cxx11::string>
                (in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50,
                 (char (*) [30])CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb40);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb70._M_current);
        testing::AssertionResult::failure_message((AssertionResult *)0x1c8d06);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb70._M_current,
                   (Type)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                   (char *)in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20)
                   ,(char *)in_stack_fffffffffffffb50);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
        testing::Message::~Message((Message *)0x1c8d69);
      }
      local_13c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c8dd7);
      if (local_13c == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                   (char *)in_stack_fffffffffffffb78._M_current,
                   (allocator<char> *)in_stack_fffffffffffffb70._M_current);
        cppjieba::MPSegment::Cut
                  ((MPSegment *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                   in_stack_fffffffffffffb78._M_current,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb70._M_current,(size_t)in_stack_fffffffffffffb68);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator(&local_1f1);
        std::operator<<(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        testing::internal::EqHelper<false>::Compare<char[34],std::__cxx11::string>
                  (in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50,
                   (char (*) [34])CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb40);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffb70._M_current);
          testing::AssertionResult::failure_message((AssertionResult *)0x1c8f5c);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffb70._M_current,
                     (Type)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                     (char *)in_stack_fffffffffffffb60,
                     (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                     (char *)in_stack_fffffffffffffb50);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
          testing::Message::~Message((Message *)0x1c8fbf);
        }
        local_13c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c902d);
        if (local_13c == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                     (char *)in_stack_fffffffffffffb78._M_current,
                     (allocator<char> *)in_stack_fffffffffffffb70._M_current);
          cppjieba::MPSegment::Cut
                    ((MPSegment *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb78._M_current,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb70._M_current,(size_t)in_stack_fffffffffffffb68);
          std::__cxx11::string::~string(local_238);
          std::allocator<char>::~allocator(&local_239);
          std::operator<<(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
          testing::internal::EqHelper<false>::Compare<char[50],std::__cxx11::string>
                    (in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50,
                     (char (*) [50])CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb40);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffb70._M_current);
            testing::AssertionResult::failure_message((AssertionResult *)0x1c91b1);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffb70._M_current,
                       (Type)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                       (char *)in_stack_fffffffffffffb60,
                       (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                       (char *)in_stack_fffffffffffffb50);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffb40);
            testing::Message::~Message((Message *)0x1c920e);
          }
          local_13c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c927c);
          if (local_13c == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                       (char *)in_stack_fffffffffffffb78._M_current,
                       (allocator<char> *)in_stack_fffffffffffffb70._M_current);
            cppjieba::MPSegment::Cut
                      (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x1c92d7);
            std::__cxx11::string::~string(local_280);
            std::allocator<char>::~allocator(&local_281);
            message = local_f0;
            local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffffb38);
            local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffffb38);
            this_01 = (AssertHelper *)&local_2d9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                       (char *)in_stack_fffffffffffffb78._M_current,
                       (allocator<char> *)in_stack_fffffffffffffb70._M_current);
            limonp::
            Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68
                      );
            std::__cxx11::string::operator=(local_d8,local_2a8);
            std::__cxx11::string::~string(local_2a8);
            std::__cxx11::string::~string((string *)((long)&local_2d9 + 1));
            std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
            testing::internal::EqHelper<false>::Compare<char[26],std::__cxx11::string>
                      (in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50,
                       (char (*) [26])CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb40);
            iVar2 = (int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
            uVar3 = bVar1;
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffb70._M_current);
              in_stack_fffffffffffffb78._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x1c94dd);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffb70._M_current,
                         (Type)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                         (char *)in_stack_fffffffffffffb60,iVar2,(char *)in_stack_fffffffffffffb50);
              testing::internal::AssertHelper::operator=(this_01,message);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffb40);
              testing::Message::~Message((Message *)0x1c953a);
            }
            local_13c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c95a8);
            if (local_13c == 0) {
              end._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_321;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar3,in_stack_fffffffffffffb80),
                         (char *)in_stack_fffffffffffffb78._M_current,
                         (allocator<char> *)end._M_current);
              cppjieba::MPSegment::Cut
                        ((MPSegment *)CONCAT17(uVar3,in_stack_fffffffffffffb80),
                         in_stack_fffffffffffffb78._M_current,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)end._M_current,(size_t)in_stack_fffffffffffffb68);
              std::__cxx11::string::~string(local_320);
              std::allocator<char>::~allocator(&local_321);
              file = local_f0;
              local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffffb38);
              local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffffb38);
              connector = (string *)local_379;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar3,in_stack_fffffffffffffb80),
                         (char *)in_stack_fffffffffffffb78._M_current,
                         (allocator<char> *)end._M_current);
              limonp::
              Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (in_stack_fffffffffffffb78,end,connector);
              type = (Type)((ulong)connector >> 0x20);
              this_00 = local_d8;
              in_stack_fffffffffffffb50 = local_348;
              std::__cxx11::string::operator=(this_00,in_stack_fffffffffffffb50);
              std::__cxx11::string::~string(in_stack_fffffffffffffb50);
              std::__cxx11::string::~string((string *)(local_379 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_379);
              testing::internal::EqHelper<false>::Compare<char[27],std::__cxx11::string>
                        ((char *)this_00,(char *)in_stack_fffffffffffffb50,
                         (char (*) [27])
                         CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb40);
              iVar2 = (int)((ulong)this_00 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_390);
              if (!bVar1) {
                testing::Message::Message((Message *)end._M_current);
                in_stack_fffffffffffffb40 =
                     (MPSegment *)
                     testing::AssertionResult::failure_message((AssertionResult *)0x1c980e);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)end._M_current,type,(char *)file,iVar2,
                           (char *)in_stack_fffffffffffffb50);
                testing::internal::AssertHelper::operator=(this_01,message);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffb40);
                testing::Message::~Message((Message *)0x1c986b);
              }
              local_13c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c98d6);
              if (local_13c == 0) {
                local_13c = 0;
              }
            }
          }
        }
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb50);
  std::__cxx11::string::~string(local_d8);
  cppjieba::MPSegment::~MPSegment(in_stack_fffffffffffffb40);
  return;
}

Assistant:

TEST(MPSegmentTest, Test1) {
  MPSegment segment("../dict/jieba.dict.utf8");;
  string s;
  vector<string> words;
  segment.Cut("我来自北京邮电大学。", words);
  ASSERT_EQ("[\"我\", \"来自\", \"北京邮电大学\", \"。\"]", s << words);

  segment.Cut("B超 T恤", words);
  ASSERT_EQ(s << words, "[\"B超\", \" \", \"T恤\"]");

  segment.Cut("南京市长江大桥", words);
  ASSERT_EQ("[\"南京市\", \"长江大桥\"]", s << words);

  // MaxWordLen
  segment.Cut("南京市长江大桥", words, 3);
  ASSERT_EQ("[\"南京市\", \"长江\", \"大桥\"]", s << words);

  segment.Cut("南京市长江大桥", words, 0);
  ASSERT_EQ("[\"南\", \"京\", \"市\", \"长\", \"江\", \"大\", \"桥\"]", s << words);

  segment.Cut("湖南长沙市天心区", words);
  s = Join(words.begin(), words.end(), "/");
  ASSERT_EQ("湖南长沙市/天心区", s);

  segment.Cut("湖南长沙市天心区", words, 3);
  s = Join(words.begin(), words.end(), "/");
  ASSERT_EQ("湖南/长沙市/天心区", s);
}